

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_create(REF_CELL *ref_cell_ptr,REF_CELL_TYPE type)

{
  uint uVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  
  ref_cell = (REF_CELL)malloc(0x48);
  *ref_cell_ptr = ref_cell;
  if (ref_cell == (REF_CELL)0x0) {
    pcVar6 = "malloc *ref_cell_ptr of REF_CELL_STRUCT NULL";
    uVar4 = 0x1bb;
LAB_001cabd4:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_create",pcVar6);
    uVar1 = 2;
  }
  else {
    uVar1 = ref_cell_initialize(ref_cell,type);
    if (uVar1 == 0) {
      ref_cell->n = 0;
      ref_cell->max = 100;
      uVar1 = ref_cell->size_per;
      if ((int)uVar1 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x1c7,"ref_cell_create","malloc ref_cell->c2n of REF_INT negative");
        return 1;
      }
      pRVar2 = (REF_INT *)malloc((ulong)uVar1 * 400);
      ref_cell->c2n = pRVar2;
      if (pRVar2 == (REF_INT *)0x0) {
        pcVar6 = "malloc ref_cell->c2n of REF_INT NULL";
        uVar4 = 0x1c7;
        goto LAB_001cabd4;
      }
      pRVar3 = pRVar2 + 1;
      lVar5 = -100;
      do {
        pRVar3[-1] = -1;
        *pRVar3 = (int)lVar5 + 0x65;
        pRVar3 = pRVar3 + uVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
      pRVar2[(ulong)(uVar1 * 99) + 1] = -1;
      ref_cell->blank = 0;
      uVar1 = ref_adj_create(&ref_cell->ref_adj);
      if (uVar1 == 0) {
        return 0;
      }
      pcVar6 = "create ref_adj for ref_cell";
      uVar4 = 0x1d0;
    }
    else {
      pcVar6 = "init";
      uVar4 = 0x1bf;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_create",(ulong)uVar1,pcVar6);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_create(REF_CELL *ref_cell_ptr, REF_CELL_TYPE type) {
  REF_INT cell;
  REF_INT max;
  REF_CELL ref_cell;

  (*ref_cell_ptr) = NULL;

  ref_malloc(*ref_cell_ptr, 1, REF_CELL_STRUCT);

  ref_cell = (*ref_cell_ptr);

  RSS(ref_cell_initialize(ref_cell, type), "init");

  max = 100;

  ref_cell_n(ref_cell) = 0;
  ref_cell_max(ref_cell) = max;

  ref_malloc(ref_cell->c2n,
             ref_cell_max(ref_cell) * ref_cell_size_per(ref_cell), REF_INT);

  for (cell = 0; cell < max; cell++) {
    ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
    ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
  }
  ref_cell_c2n(ref_cell, 1, max - 1) = REF_EMPTY;
  ref_cell_blank(ref_cell) = 0;

  RSS(ref_adj_create(&(ref_cell->ref_adj)), "create ref_adj for ref_cell");

  return REF_SUCCESS;
}